

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

void __thiscall QUrl::setHost(QUrl *this,QString *host,ParsingMode mode)

{
  uchar *puVar1;
  QUrlPrivate *pQVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QLatin1StringView after;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  detach(this);
  QUrlPrivate::clearError(this->d);
  local_38.d = (host->d).d;
  local_38.ptr = (host->d).ptr;
  local_38.size = (host->d).size;
  if (local_38.d != (Data *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (mode == DecodedMode) {
    mode = TolerantMode;
    after.m_data = "%25";
    after.m_size = 3;
    QString::replace((QString *)&local_38,(QChar)0x25,after,CaseSensitive);
  }
  bVar3 = QUrlPrivate::setHost(this->d,(QString *)&local_38,0,local_38.size,mode);
  if (!bVar3) {
    bVar3 = QString::startsWith((QString *)&local_38,(QChar)0x5b,CaseSensitive);
    if (!bVar3) {
      QString::prepend((QString *)&local_38,(QChar)0x5b);
      QString::append((QString *)&local_38,(QChar)0x5d);
      bVar3 = QUrlPrivate::setHost(this->d,(QString *)&local_38,0,local_38.size,mode);
      if (bVar3) {
        QUrlPrivate::clearError(this->d);
      }
      else {
        bVar3 = QString::contains((QString *)&local_38,(QChar)0x3a,CaseSensitive);
        pQVar2 = this->d;
        if (bVar3) {
          ((pQVar2->error)._M_t.
           super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
           super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
           super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl)->code =
               InvalidIPv6AddressError;
        }
        puVar1 = &pQVar2->sectionIsPresent;
        *puVar1 = *puVar1 & 0xf7;
      }
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrl::setHost(const QString &host, ParsingMode mode)
{
    detach();
    d->clearError();

    QString data = host;
    if (mode == DecodedMode) {
        data.replace(u'%', "%25"_L1);
        mode = TolerantMode;
    }

    if (d->setHost(data, 0, data.size(), mode)) {
        return;
    } else if (!data.startsWith(u'[')) {
        // setHost failed, it might be IPv6 or IPvFuture in need of bracketing
        Q_ASSERT(d->error);

        data.prepend(u'[');
        data.append(u']');
        if (!d->setHost(data, 0, data.size(), mode)) {
            // failed again
            if (data.contains(u':')) {
                // source data contains ':', so it's an IPv6 error
                d->error->code = QUrlPrivate::InvalidIPv6AddressError;
            }
            d->sectionIsPresent &= ~QUrlPrivate::Host;
        } else {
            // succeeded
            d->clearError();
        }
    }
}